

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtmul<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,wabt::interp::Simd<unsigned_short,(unsigned_char)8>,false>
          (Thread *this)

{
  unkbyte10 Var1;
  undefined1 auVar2 [16];
  ushort uVar7;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Value VVar8;
  Value VVar9;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  VVar8 = Pop(this);
  VVar9 = Pop(this);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = VVar9.field_0._8_8_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = VVar8.field_0._8_8_;
  auVar2 = pmulhuw(auVar3,auVar2);
  auVar4._0_2_ = VVar8.field_0._8_2_ * VVar9.field_0._8_2_;
  uVar7 = VVar8.field_0._14_2_ * VVar9.field_0._14_2_;
  auVar6._0_12_ = ZEXT212(uVar7) << 0x30;
  auVar6._12_2_ = uVar7;
  auVar6._14_2_ = auVar2._6_2_;
  auVar5._12_4_ = auVar6._12_4_;
  auVar5._0_10_ = (unkuint10)uVar7 << 0x30;
  auVar5._10_2_ = auVar2._4_2_;
  Var1 = CONCAT64(auVar5._10_6_,CONCAT22(VVar8.field_0._12_2_ * VVar9.field_0._12_2_,uVar7));
  auVar4._8_8_ = (undefined8)((unkuint10)Var1 >> 0x10);
  auVar4._6_2_ = auVar2._2_2_;
  auVar4._4_2_ = VVar8.field_0._10_2_ * VVar9.field_0._10_2_;
  auVar4._2_2_ = auVar2._0_2_;
  VVar8.field_0._12_4_ = auVar5._12_4_;
  VVar8.field_0._8_4_ = (int)((unkuint10)Var1 >> 0x10);
  VVar8.field_0._0_8_ = auVar4._0_8_;
  Push(this,VVar8);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtmul() {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = (low ? 0 : S::lanes) + i;
    result[i] = U(lhs[laneidx]) * U(rhs[laneidx]);
  }
  Push(result);
  return RunResult::Ok;
}